

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsmp.h
# Opt level: O0

ssize_t __thiscall bsplib::Bsmp::send(Bsmp *this,int __fd,void *__buf,size_t __n,int __flags)

{
  size_t sVar1;
  size_t sVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000084;
  size_t end;
  size_t start;
  TicToc t;
  size_t nbytes_local;
  void *payload_local;
  void *tag_local;
  int pid_local;
  Bsmp *this_local;
  
  t.m_nbytes = CONCAT44(in_register_00000084,__flags);
  TicToc::TicToc((TicToc *)&start,BSMP,0);
  sVar1 = A2A::send_size(&this->m_a2a,__fd);
  this->m_send_empty = false;
  serial<unsigned_long>(&this->m_a2a,__fd,t.m_nbytes + 1);
  A2A::send(&this->m_a2a,__fd,__buf,this->m_send_tag_size,__flags);
  A2A::send(&this->m_a2a,__fd,(void *)__n,t.m_nbytes,__flags);
  sVar2 = A2A::send_size(&this->m_a2a,__fd);
  TicToc::add_bytes((TicToc *)&start,sVar2 - sVar1);
  TicToc::~TicToc((TicToc *)&start);
  return extraout_RAX;
}

Assistant:

void send( int pid, const void * tag, const void * payload, size_t nbytes )
    {
#ifdef PROFILE
        TicToc t(TicToc::BSMP);
        size_t start = m_a2a.send_size(pid);
#endif
        m_send_empty = false;
        serial( m_a2a, pid, nbytes + 1 );
        m_a2a.send( pid, tag, m_send_tag_size );
        m_a2a.send( pid, payload, nbytes );
#ifdef PROFILE
        size_t end = m_a2a.send_size(pid);
        t.add_bytes(end-start);
#endif
    }